

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# 3DSHelper.h
# Opt level: O2

void __thiscall Assimp::D3DS::Mesh::~Mesh(Mesh *this)

{
  std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
            (&(this->mFaceMaterials).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
            );
  std::_Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::~_Vector_base
            (&(this->mTexCoords).
              super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>);
  std::__cxx11::string::~string((string *)&this->mName);
  MeshWithSmoothingGroups<Assimp::D3DS::Face>::~MeshWithSmoothingGroups
            (&this->super_MeshWithSmoothingGroups<Assimp::D3DS::Face>);
  return;
}

Assistant:

Mesh() = delete;